

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*>::
emplace_back<slang::syntax::PackageImportItemSyntax_const*const&>
          (SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*> *this,
          PackageImportItemSyntax **args)

{
  long lVar1;
  reference ppPVar2;
  pointer ppPVar3;
  
  lVar1 = *(long *)(this + 8);
  ppPVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppPVar3 = emplaceRealloc<slang::syntax::PackageImportItemSyntax_const*const&>(this,ppPVar3,args)
    ;
    return ppPVar3;
  }
  *ppPVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppPVar2 = SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::back
                      ((SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)this);
  return ppPVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }